

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::
BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance>::createInstance
          (BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance> *this,
          Context *context)

{
  TestInstance *this_00;
  Context *context_local;
  BaseTestCase<vkt::rasterization::(anonymous_namespace)::TrianglesTestInstance> *this_local;
  
  this_00 = (TestInstance *)operator_new(0x290);
  TrianglesTestInstance::TrianglesTestInstance
            ((TrianglesTestInstance *)this_00,context,
             (this->super_BaseRenderingTestCase).m_sampleCount);
  return this_00;
}

Assistant:

virtual TestInstance*	createInstance	(Context& context) const
							{
								return new ConcreteTestInstance(context, m_sampleCount);
							}